

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_sendWithReceiverType
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t receiverTypeOperand,
               int16_t selectorOperand,size_t argumentCount,int16_t *argumentOperands,
               int applicationFlags)

{
  void *value;
  int32_t offset;
  undefined6 in_register_0000000a;
  undefined8 uVar1;
  sysbvm_x86_register_t reg;
  undefined6 in_register_00000032;
  ulong uVar2;
  size_t i;
  long lVar3;
  
  uVar2 = CONCAT62(in_register_00000032,resultOperand);
  uVar1 = CONCAT62(in_register_0000000a,selectorOperand);
  for (lVar3 = 0; offset = (int32_t)uVar1, argumentCount + 1 != lVar3; lVar3 = lVar3 + 1) {
    uVar2 = (ulong)(uint)(int)argumentOperands[lVar3];
    sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[lVar3],(int32_t)lVar3);
  }
  sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)uVar2);
  value = sysbvm_chunkedAllocator_allocate(&(jit->context->heap).picTableAllocator,0x68,8);
  sysbvm_jit_x86_mov64Absolute(jit,SYSBVM_X86_64_ARG1,(uint64_t)value);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,receiverTypeOperand);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG3,selectorOperand);
  sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_R8,(int32_t)argumentCount);
  sysbvm_jit_x86_leaRegisterWithOffset(jit,SYSBVM_X86_R9,jit->callArgumentVectorOffset,offset);
  sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit,SYSBVM_X86_ESP,0,applicationFlags);
  sysbvm_jit_x86_call(jit,sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments);
  sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_sendWithReceiverType(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t receiverTypeOperand, int16_t selectorOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    // Push all of the arguments in the stack.
    for(size_t i = 0; i < argumentCount + 1; ++i)
        sysbvm_jit_moveOperandToCallArgumentVector(jit, argumentOperands[i], (int32_t)i);

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);

    sysbvm_pic_t *pic = (sysbvm_pic_t*)sysbvm_chunkedAllocator_allocate(&jit->context->heap.picTableAllocator, sizeof(sysbvm_pic_t), sizeof(uintptr_t));
    sysbvm_jit_x86_mov64Absolute(jit, SYSBVM_X86_64_ARG1, (uint64_t)pic);

    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, receiverTypeOperand);

    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG3, selectorOperand);
#ifdef _WIN32
    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 4*sizeof(void*), (int32_t)argumentCount);

    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_RAX, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);
    sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 5*sizeof(void*), SYSBVM_X86_RAX);

    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 6*sizeof(void*), applicationFlags);
#else
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_SYSV_ARG4, (int32_t)argumentCount);

    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_SYSV_ARG5, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);

    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 0*sizeof(void*), applicationFlags);
#endif
    sysbvm_jit_x86_call(jit, &sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments);

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}